

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_ignored_stdio(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 == 0) {
      if (exit_cb_called == 1) {
        if (close_cb_called == 1) {
          loop = (uv_loop_t *)uv_default_loop();
          close_loop(loop);
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_close(uVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uVar2 = 0x2f3;
        }
        else {
          pcVar3 = "close_cb_called == 1";
          uVar2 = 0x2f1;
        }
      }
      else {
        pcVar3 = "exit_cb_called == 1";
        uVar2 = 0x2f0;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x2ee;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x2eb;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(spawn_ignored_stdio) {
  int r;

  init_process_options("spawn_helper6", exit_cb);

  options.stdio = NULL;
  options.stdio_count = 0;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}